

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_solve_dense.c
# Opt level: O1

void __thiscall lu_solve_dense(void *this,double *rhs,double *lhs,char trans)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  void *__dest;
  bool bVar14;
  int iVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  uint uVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  uint uVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  double dVar29;
  byte local_bc;
  
  iVar1 = *(int *)((long)this + 0x54);
  lVar16 = (long)iVar1;
  uVar21 = *(uint *)((long)this + 0x68);
  uVar17 = (ulong)uVar21;
  lVar28 = *(long *)((long)this + 0x250);
  lVar19 = *(long *)((long)this + 0x200);
  lVar22 = *(long *)((long)this + 0x1d8);
  lVar4 = *(long *)((long)this + 0x1e8);
  lVar20 = *(long *)((long)this + 0x278);
  lVar18 = *(long *)((long)this + 0x240);
  lVar26 = *(long *)((long)this + 0x280);
  piVar5 = *(int **)((long)this + 0x1f8);
  lVar23 = *(long *)((long)this + 0x218);
  lVar6 = *(long *)((long)this + 0x228);
  lVar7 = *(long *)((long)this + 0x2a8);
  lVar27 = *(long *)((long)this + 0x2b0);
  lVar8 = *(long *)((long)this + 0x1a0);
  lVar9 = *(long *)((long)this + 0x1b8);
  lVar10 = *(long *)((long)this + 0x1a8);
  lVar11 = *(long *)((long)this + 0x1c0);
  lVar12 = *(long *)((long)this + 0x1b0);
  lVar13 = *(long *)((long)this + 0x1c8);
  __dest = *(void **)((long)this + 0x2a0);
  lu_garbage_perm(this);
  local_bc = trans & 0xdf;
  memcpy(__dest,rhs,lVar16 * 8);
  if (local_bc == 0x54) {
    if (0 < iVar1) {
      lVar18 = 0;
      do {
        lVar27 = (long)*(int *)(lVar22 + lVar18 * 4);
        dVar29 = *(double *)((long)__dest + lVar27 * 8) / *(double *)(lVar7 + lVar27 * 8);
        iVar15 = *(int *)(lVar4 + lVar18 * 4);
        iVar2 = *(int *)(lVar23 + lVar27 * 4);
        lVar26 = (long)iVar2;
        iVar3 = *(int *)(lVar6 + lVar27 * 4);
        if (iVar2 < iVar3) {
          do {
            lVar27 = (long)*(int *)(lVar12 + lVar26 * 4);
            *(double *)((long)__dest + lVar27 * 8) =
                 *(double *)(lVar13 + lVar26 * 8) * -dVar29 + *(double *)((long)__dest + lVar27 * 8)
            ;
            lVar26 = lVar26 + 1;
          } while (iVar3 != lVar26);
        }
        lhs[iVar15] = dVar29;
        lVar18 = lVar18 + 1;
      } while (lVar18 != lVar16);
    }
    if (0 < (int)uVar21) {
      do {
        lVar22 = (long)piVar5[uVar17 - 1];
        iVar15 = piVar5[uVar17];
        if (piVar5[uVar17 - 1] < iVar15) {
          dVar29 = lhs[*(int *)(lVar19 + (uVar17 - 1) * 4)];
          do {
            iVar2 = *(int *)(lVar8 + lVar22 * 4);
            lhs[iVar2] = *(double *)(lVar9 + lVar22 * 8) * -dVar29 + lhs[iVar2];
            lVar22 = lVar22 + 1;
          } while (iVar15 != lVar22);
        }
        bVar14 = 1 < (long)uVar17;
        uVar17 = uVar17 - 1;
      } while (bVar14);
    }
    if (0 < iVar1) {
      do {
        lVar19 = (long)*(int *)(lVar20 + -4 + lVar16 * 4);
        uVar21 = *(uint *)(lVar8 + lVar19 * 4);
        if ((int)uVar21 < 0) {
          dVar29 = 0.0;
        }
        else {
          lVar19 = lVar19 << 2;
          dVar29 = 0.0;
          do {
            dVar29 = dVar29 + lhs[uVar21] * *(double *)(lVar9 + lVar19 * 2);
            uVar21 = *(uint *)(lVar8 + 4 + lVar19);
            lVar19 = lVar19 + 4;
          } while (-1 < (int)uVar21);
        }
        iVar1 = *(int *)(lVar28 + (lVar16 + -1) * 4);
        lhs[iVar1] = lhs[iVar1] - dVar29;
        bVar14 = 1 < lVar16;
        lVar16 = lVar16 + -1;
      } while (bVar14);
    }
  }
  else {
    if (0 < iVar1) {
      lVar20 = 0;
      do {
        lVar23 = (long)*(int *)(lVar18 + lVar20 * 4);
        uVar25 = *(uint *)(lVar8 + lVar23 * 4);
        if ((int)uVar25 < 0) {
          dVar29 = 0.0;
        }
        else {
          lVar23 = lVar23 << 2;
          dVar29 = 0.0;
          do {
            dVar29 = dVar29 + *(double *)((long)__dest + (ulong)uVar25 * 8) *
                              *(double *)(lVar9 + lVar23 * 2);
            uVar25 = *(uint *)(lVar8 + 4 + lVar23);
            lVar23 = lVar23 + 4;
          } while (-1 < (int)uVar25);
        }
        lVar23 = (long)*(int *)(lVar28 + lVar20 * 4);
        *(double *)((long)__dest + lVar23 * 8) = *(double *)((long)__dest + lVar23 * 8) - dVar29;
        lVar20 = lVar20 + 1;
      } while (lVar20 != lVar16);
    }
    if (0 < (int)uVar21) {
      iVar15 = *piVar5;
      uVar24 = 0;
      do {
        dVar29 = 0.0;
        if (iVar15 < piVar5[uVar24 + 1]) {
          lVar28 = (long)iVar15;
          lVar20 = 0;
          do {
            dVar29 = dVar29 + *(double *)
                               ((long)__dest + (long)*(int *)(lVar28 * 4 + lVar8 + lVar20 * 4) * 8)
                              * *(double *)(lVar9 + lVar28 * 8 + lVar20 * 8);
            lVar20 = lVar20 + 1;
          } while (piVar5[uVar24 + 1] - lVar28 != lVar20);
          iVar15 = iVar15 + (int)lVar20;
        }
        lVar28 = (long)*(int *)(lVar19 + uVar24 * 4);
        uVar24 = uVar24 + 1;
        *(double *)((long)__dest + lVar28 * 8) = *(double *)((long)__dest + lVar28 * 8) - dVar29;
      } while (uVar24 != uVar17);
    }
    if (0 < iVar1) {
      do {
        lVar28 = (long)*(int *)(lVar4 + -4 + lVar16 * 4);
        dVar29 = *(double *)((long)__dest + lVar28 * 8) / *(double *)(lVar27 + lVar28 * 8);
        iVar1 = *(int *)(lVar22 + -4 + lVar16 * 4);
        lVar28 = (long)*(int *)(lVar26 + lVar28 * 4);
        uVar21 = *(uint *)(lVar10 + lVar28 * 4);
        if (-1 < (int)uVar21) {
          lVar28 = lVar28 << 2;
          do {
            *(double *)((long)__dest + (ulong)uVar21 * 8) =
                 *(double *)(lVar11 + lVar28 * 2) * -dVar29 +
                 *(double *)((long)__dest + (ulong)uVar21 * 8);
            uVar21 = *(uint *)(lVar10 + 4 + lVar28);
            lVar28 = lVar28 + 4;
          } while (-1 < (int)uVar21);
        }
        lhs[iVar1] = dVar29;
        bVar14 = 1 < lVar16;
        lVar16 = lVar16 + -1;
      } while (bVar14);
    }
  }
  return;
}

Assistant:

void lu_solve_dense(struct lu *this, const double *rhs, double *lhs, char trans)
{
    const lu_int m                  = this->m;
    const lu_int nforrest           = this->nforrest;
    const lu_int *p                 = this->p;
    const lu_int *eta_row           = this->eta_row;
    const lu_int *pivotcol          = this->pivotcol;
    const lu_int *pivotrow          = this->pivotrow;
    const lu_int *Lbegin_p          = this->Lbegin_p;
    const lu_int *Ltbegin_p         = this->Ltbegin_p;
    const lu_int *Ubegin            = this->Ubegin;
    const lu_int *Rbegin            = this->Rbegin;
    const lu_int *Wbegin            = this->Wbegin;
    const lu_int *Wend              = this->Wend;
    const double *col_pivot         = this->col_pivot;
    const double *row_pivot         = this->row_pivot;
    const lu_int *Lindex            = this->Lindex;
    const double *Lvalue            = this->Lvalue;
    const lu_int *Uindex            = this->Uindex;
    const double *Uvalue            = this->Uvalue;
    const lu_int *Windex            = this->Windex;
    const double *Wvalue            = this->Wvalue;
    double *work1                   = this->work1;

    lu_int i, k, t, ipivot, jpivot, pos;
    double x;

    lu_garbage_perm(this);
    assert(this->pivotlen == m);

    if (trans == 't' || trans == 'T')
    {
        /* ----------------------- */
        /* Solve transposed system */
        /* ----------------------- */

        memcpy(work1, rhs, m*sizeof(double));

        /* Solve with U'. */
        for (k = 0; k < m; k++)
        {
            jpivot = pivotcol[k];
            ipivot = pivotrow[k];
            x = work1[jpivot] / col_pivot[jpivot];
            for (pos = Wbegin[jpivot]; pos < Wend[jpivot]; pos++)
            {
                work1[Windex[pos]] -= x * Wvalue[pos];
            }
            lhs[ipivot] = x;
        }

        /* Solve with update ETAs backwards. */
        for (t = nforrest-1; t >= 0; t--)
        {
            ipivot = eta_row[t];
            x = lhs[ipivot];
            for (pos = Rbegin[t]; pos < Rbegin[t+1]; pos++)
            {
                i = Lindex[pos];
                lhs[i] -= x * Lvalue[pos];
            }
        }

        /* Solve with L'. */
        for (k = m-1; k >= 0; k--)
        {
            x = 0.0;
            for (pos = Lbegin_p[k]; (i = Lindex[pos]) >= 0; pos++)
            {
                x += lhs[i] * Lvalue[pos];
            }
            lhs[p[k]] -= x;
        }
    }
    else
    {
        /* -------------------- */
        /* Solve forward system */
        /* -------------------- */

        memcpy(work1, rhs, m*sizeof(double));

        /* Solve with L. */
        for (k = 0; k < m; k++)
        {
            x = 0.0;
            for (pos = Ltbegin_p[k]; (i = Lindex[pos]) >= 0; pos++)
            {
                x += work1[i] * Lvalue[pos];
            }
            work1[p[k]] -= x;
        }

        /* Solve with update ETAs. */
        pos = Rbegin[0];
        for (t = 0; t < nforrest; t++)
        {
            ipivot = eta_row[t];
            x = 0.0;
            for ( ; pos < Rbegin[t+1]; pos++)
            {
                x += work1[Lindex[pos]] * Lvalue[pos];
            }
            work1[ipivot] -= x;
        }

        /* Solve with U. */
        for (k = m-1; k >= 0; k--)
        {
            jpivot = pivotcol[k];
            ipivot = pivotrow[k];
            x = work1[ipivot] / row_pivot[ipivot];
            for (pos = Ubegin[ipivot]; (i = Uindex[pos]) >= 0; pos++)
            {
                work1[i] -= x * Uvalue[pos];
            }
            lhs[jpivot] = x;
        }
    }
}